

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# order_book_perf_test.cc
# Opt level: O0

int main(void)

{
  ostream *poVar1;
  ulong uVar2;
  order_book *this;
  type remove_duration;
  type cancel_duration;
  type add_duration;
  order_book ob;
  unsigned_long count;
  duration<long,_std::ratio<1L,_1000000000L>_> *in_stack_fffffffffffffe18;
  unsigned_long in_stack_fffffffffffffe30;
  order_book *in_stack_fffffffffffffe38;
  size_t in_stack_fffffffffffffe48;
  uint64_t in_stack_fffffffffffffe50;
  string *in_stack_fffffffffffffe58;
  order_book *in_stack_fffffffffffffe60;
  duration<long,_std::ratio<1L,_1000000000L>_> local_150;
  duration<long,_std::ratio<1L,_1000000000L>_> local_148;
  duration<long,_std::ratio<1L,_1000000000L>_> in_stack_fffffffffffffec0;
  order_book *in_stack_fffffffffffffec8;
  allocator local_109;
  string local_108 [256];
  ulong local_8;
  
  local_8 = 20000000;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_108,"AXP",&local_109);
  helix::order_book::order_book
            (in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,in_stack_fffffffffffffe50,
             in_stack_fffffffffffffe48);
  std::__cxx11::string::~string(local_108);
  std::allocator<char>::~allocator((allocator<char> *)&local_109);
  test_add(in_stack_fffffffffffffec8,in_stack_fffffffffffffec0.__r);
  test_cancel(in_stack_fffffffffffffe38,in_stack_fffffffffffffe30);
  test_remove(in_stack_fffffffffffffe38,in_stack_fffffffffffffe30);
  poVar1 = std::operator<<((ostream *)&std::cout,"order_book::add()    ");
  std::chrono::
  duration_cast<std::chrono::duration<long,std::ratio<1l,1000000000l>>,long,std::ratio<1l,1000000000l>>
            (in_stack_fffffffffffffe18);
  uVar2 = std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>::count
                    ((duration<long,_std::ratio<1L,_1000000000L>_> *)&stack0xfffffffffffffec0);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,uVar2 / local_8);
  poVar1 = std::operator<<(poVar1," ns/op");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"order_book::cancel() ");
  local_148.__r =
       (rep)std::chrono::
            duration_cast<std::chrono::duration<long,std::ratio<1l,1000000000l>>,long,std::ratio<1l,1000000000l>>
                      (in_stack_fffffffffffffe18);
  uVar2 = std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>::count(&local_148);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,uVar2 / local_8);
  poVar1 = std::operator<<(poVar1," ns/op");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"order_book::remove() ");
  local_150.__r =
       (rep)std::chrono::
            duration_cast<std::chrono::duration<long,std::ratio<1l,1000000000l>>,long,std::ratio<1l,1000000000l>>
                      (in_stack_fffffffffffffe18);
  uVar2 = std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>::count(&local_150);
  this = (order_book *)std::ostream::operator<<(poVar1,uVar2 / local_8);
  poVar1 = std::operator<<((ostream *)this," ns/op");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  helix::order_book::~order_book(this);
  return 0;
}

Assistant:

int main()
{
    unsigned long count = 20000000;

    order_book ob{"AXP", 0, count};
    auto add_duration = test_add(ob, count);
    auto cancel_duration = test_cancel(ob, count);
    auto remove_duration = test_remove(ob, count);

    std::cout << "order_book::add()    " << std::chrono::duration_cast<std::chrono::nanoseconds>(add_duration).count() / count << " ns/op" << std::endl;
    std::cout << "order_book::cancel() " << std::chrono::duration_cast<std::chrono::nanoseconds>(cancel_duration).count() / count << " ns/op" << std::endl;
    std::cout << "order_book::remove() " << std::chrono::duration_cast<std::chrono::nanoseconds>(remove_duration).count() / count << " ns/op" << std::endl;
}